

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::EventLoop(EventLoop *this)

{
  sz_pid_t sVar1;
  sz_event fd;
  Poller *pPVar2;
  TimerQueue *this_00;
  Channel *pCVar3;
  self *psVar4;
  LogStream *pLVar5;
  long in_FS_OFFSET;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1048 [4048];
  undefined1 local_78 [12];
  undefined1 local_68 [12];
  function<void_(sznet::Timestamp)> local_58;
  unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_> *local_38;
  
  this->_vptr_EventLoop = (_func_int **)&PTR__EventLoop_00121b50;
  this->m_iteration = 0;
  this->m_looping = false;
  this->m_quit = (__atomic_base<bool>)0x0;
  this->m_eventHandling = false;
  this->m_callingPendingFunctors = false;
  sVar1 = CurrentThread::tid();
  this->m_threadId = sVar1;
  Timestamp::Timestamp(&this->m_pollTime);
  pPVar2 = Poller::newDefaultPoller(this);
  (this->m_poller)._M_t.
  super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>.
  super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl = pPVar2;
  this_00 = (TimerQueue *)operator_new(0x50);
  TimerQueue::TimerQueue(this_00,this);
  (this->m_timerQueue)._M_t.
  super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>._M_t.
  super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
  super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl = this_00;
  fd = sockets::sz_create_eventfd();
  this->m_wakeupFd = fd;
  pCVar3 = (Channel *)operator_new(0xb8);
  Channel::Channel(pCVar3,this,fd);
  local_38 = &this->m_wakeupChannel;
  (this->m_wakeupChannel)._M_t.
  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
  super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl = pCVar3;
  (this->m_activeChannels).
  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_activeChannels).
  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_activeChannels).
  super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_currentActiveChannel = (Channel *)0x0;
  MutexLock::MutexLock(&this->m_mutex);
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pendingFunctors).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_78,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_78._0_8_;
    file.m_size = local_78._8_4_;
    Logger::Logger((Logger *)local_1048,file,0x38,DEBUG,"EventLoop");
    psVar4 = LogStream::operator<<((LogStream *)(local_1048 + 8),"EventLoop created ");
    pLVar5 = LogStream::operator<<(psVar4,this);
    psVar4 = LogStream::operator<<(pLVar5," in thread ");
    LogStream::operator<<(psVar4,this->m_threadId);
    Logger::~Logger((Logger *)local_1048);
  }
  if (*(long *)(in_FS_OFFSET + -0x238) == 0) {
    *(EventLoop **)(in_FS_OFFSET + -0x238) = this;
  }
  else {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_68,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_68._0_8_;
    file_00.m_size = local_68._8_4_;
    Logger::Logger((Logger *)local_1048,file_00,0x3b,FATAL);
    psVar4 = LogStream::operator<<((LogStream *)(local_1048 + 8),"Another EventLoop ");
    pLVar5 = LogStream::operator<<(psVar4,*(void **)(in_FS_OFFSET + -0x238));
    psVar4 = LogStream::operator<<(pLVar5," exists in this thread ");
    LogStream::operator<<(psVar4,this->m_threadId);
    Logger::~Logger((Logger *)local_1048);
  }
  pCVar3 = (this->m_wakeupChannel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_1048._0_8_ = handleRead;
  local_1048._8_8_ = 0;
  local_1048._16_8_ = this;
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(sznet::net::EventLoop::*(sznet::net::EventLoop*))()>,void>
            ((function<void(sznet::Timestamp)> *)&local_58,
             (_Bind<void_(sznet::net::EventLoop::*(sznet::net::EventLoop_*))()> *)local_1048);
  std::function<void_(sznet::Timestamp)>::operator=(&pCVar3->m_readCallback,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  Channel::enableReading
            ((local_38->_M_t).
             super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
             .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl);
  return;
}

Assistant:

EventLoop::EventLoop():
	m_looping(false),
	m_quit(false),
	m_eventHandling(false),
	m_callingPendingFunctors(false),
	m_iteration(0),
	m_threadId(CurrentThread::tid()),
	m_poller(Poller::newDefaultPoller(this)),
	m_timerQueue(new TimerQueue(this)),
	m_wakeupFd(sockets::sz_create_eventfd()),
#if defined(SZ_OS_WINDOWS)
	m_wakeupChannel(new Channel(this, m_wakeupFd.event_read)),
#else
	m_wakeupChannel(new Channel(this, m_wakeupFd)),
#endif
	m_currentActiveChannel(nullptr)
{
	LOG_DEBUG << "EventLoop created " << this << " in thread " << m_threadId;
	if (t_loopInThisThread)
	{
		LOG_FATAL << "Another EventLoop " << t_loopInThisThread
			<< " exists in this thread " << m_threadId;
	}
	else
	{
		t_loopInThisThread = this;
	}
	m_wakeupChannel->setReadCallback(std::bind(&EventLoop::handleRead, this));
	m_wakeupChannel->enableReading();
}